

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

string * __thiscall
cmStateSnapshot::GetExecutionListFile_abi_cxx11_
          (string *__return_storage_ptr__,cmStateSnapshot *this)

{
  PointerType pSVar1;
  ReferenceType pbVar2;
  
  pSVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pbVar2 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::iterator::operator*(&pSVar1->ExecutionListFile);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmStateSnapshot::GetExecutionListFile() const
{
  return *this->Position->ExecutionListFile;
}